

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O1

TestCaseGroup * vkt::SpirVAssembly::createOpCompositeInsertGroup(TestContext *testCtx)

{
  long lVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  deUint32 dVar3;
  TestNode *pTVar4;
  long *plVar5;
  SpvAsmComputeShaderCase *this;
  mapped_type *pmVar6;
  long *plVar7;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar8;
  NumberType type;
  pointer params;
  string description;
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  testCases;
  Random rnd;
  string typeName;
  string local_1a8;
  TestNode *local_188;
  TestNode *local_180;
  float local_174;
  TestContext *local_170;
  long *local_168;
  long local_160;
  long local_158;
  long lStack_150;
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_148;
  deRandom local_128;
  string local_118;
  undefined1 local_f8 [64];
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  local_b8;
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  local_a0;
  int local_88 [4];
  pointer local_78;
  pointer local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  pTVar4 = (TestNode *)operator_new(0x70);
  local_170 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,testCtx,"opcompositeinsert",
             "Test the OpCompositeInsert instruction");
  local_180 = pTVar4;
  dVar3 = deStringHash((pTVar4->m_name)._M_dataplus._M_p);
  deRandom_init(&local_128,dVar3);
  paVar2 = &local_1a8.field_2;
  type = TYPE_INT;
  uVar8 = extraout_RDX;
  do {
    getNumberTypeName_abi_cxx11_(&local_118,(SpirVAssembly *)(ulong)type,(NumberType)uVar8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   "Test the OpCompositeInsert instruction with ",&local_118);
    plVar5 = (long *)std::__cxx11::string::append((char *)local_f8);
    local_168 = &local_158;
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_158 = *plVar7;
      lStack_150 = plVar5[3];
    }
    else {
      local_158 = *plVar7;
      local_168 = (long *)*plVar5;
    }
    local_160 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
      operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
    }
    local_188 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)local_188,local_170,local_118._M_dataplus._M_p,(char *)local_168);
    local_148.
    super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x0;
    local_148.
    super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x0;
    local_148.
    super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    createCompositeCases(&local_148,(Random *)&local_128,type);
    for (params = local_148.
                  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pTVar4 = local_188,
        params != local_148.
                  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; params = params + 1) {
      ComputeShaderSpec::ComputeShaderSpec((ComputeShaderSpec *)local_f8);
      specializeCompositeInsertShaderTemplate(&local_1a8,type,params);
      std::__cxx11::string::_M_assign((string *)local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar2) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      if (type == TYPE_INT) {
        dVar3 = deRandom_getUint32(&local_128);
        createCompositeBuffer<int>((SpirVAssembly *)&local_1a8,dVar3);
        std::
        vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
        ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>
                  ((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
                    *)&local_b8,(SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_1a8);
        if ((long *)local_1a8._M_string_length != (long *)0x0) {
          LOCK();
          plVar5 = (long *)(local_1a8._M_string_length + 8);
          *(int *)plVar5 = (int)*plVar5 + -1;
          UNLOCK();
          if ((int)*plVar5 == 0) {
            local_1a8._M_dataplus._M_p = (pointer)0x0;
            (**(code **)(*(long *)local_1a8._M_string_length + 0x10))();
          }
          LOCK();
          lVar1 = local_1a8._M_string_length + 0xc;
          *(int *)lVar1 = *(int *)lVar1 + -1;
          UNLOCK();
          if (*(int *)lVar1 == 0) {
            if ((long *)local_1a8._M_string_length != (long *)0x0) {
              (**(code **)(*(long *)local_1a8._M_string_length + 8))();
            }
            local_1a8._M_string_length = 0;
          }
        }
        createCompositeBuffer<int>((SpirVAssembly *)&local_1a8,dVar3);
        std::
        vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
        ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>
                  ((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
                    *)&local_a0,(SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_1a8);
LAB_00544eaf:
        if ((long *)local_1a8._M_string_length != (long *)0x0) {
          LOCK();
          plVar5 = (long *)(local_1a8._M_string_length + 8);
          *(int *)plVar5 = (int)*plVar5 + -1;
          UNLOCK();
          if ((int)*plVar5 == 0) {
            local_1a8._M_dataplus._M_p = (pointer)0x0;
            (**(code **)(*(long *)local_1a8._M_string_length + 0x10))();
          }
          LOCK();
          lVar1 = local_1a8._M_string_length + 0xc;
          *(int *)lVar1 = *(int *)lVar1 + -1;
          UNLOCK();
          if (*(int *)lVar1 == 0) {
            if ((long *)local_1a8._M_string_length != (long *)0x0) {
              (**(code **)(*(long *)local_1a8._M_string_length + 8))();
            }
            local_1a8._M_string_length = 0;
          }
        }
      }
      else {
        if (type == TYPE_UINT) {
          dVar3 = deRandom_getUint32(&local_128);
          createCompositeBuffer<unsigned_int>((SpirVAssembly *)&local_1a8,dVar3);
          std::
          vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
          ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>
                    ((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
                      *)&local_b8,(SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_1a8);
          if ((long *)local_1a8._M_string_length != (long *)0x0) {
            LOCK();
            plVar5 = (long *)(local_1a8._M_string_length + 8);
            *(int *)plVar5 = (int)*plVar5 + -1;
            UNLOCK();
            if ((int)*plVar5 == 0) {
              local_1a8._M_dataplus._M_p = (pointer)0x0;
              (**(code **)(*(long *)local_1a8._M_string_length + 0x10))();
            }
            LOCK();
            lVar1 = local_1a8._M_string_length + 0xc;
            *(int *)lVar1 = *(int *)lVar1 + -1;
            UNLOCK();
            if (*(int *)lVar1 == 0) {
              if ((long *)local_1a8._M_string_length != (long *)0x0) {
                (**(code **)(*(long *)local_1a8._M_string_length + 8))();
              }
              local_1a8._M_string_length = 0;
            }
          }
          createCompositeBuffer<unsigned_int>((SpirVAssembly *)&local_1a8,dVar3);
          std::
          vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
          ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>
                    ((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
                      *)&local_a0,(SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_1a8);
          goto LAB_00544eaf;
        }
        if (type == TYPE_FLOAT) {
          local_174 = deRandom_getFloat(&local_128);
          createCompositeBuffer<float>((SpirVAssembly *)&local_1a8,local_174);
          std::
          vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
          ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>
                    ((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
                      *)&local_b8,(SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_1a8);
          if ((long *)local_1a8._M_string_length != (long *)0x0) {
            LOCK();
            plVar5 = (long *)(local_1a8._M_string_length + 8);
            *(int *)plVar5 = (int)*plVar5 + -1;
            UNLOCK();
            if ((int)*plVar5 == 0) {
              local_1a8._M_dataplus._M_p = (pointer)0x0;
              (**(code **)(*(long *)local_1a8._M_string_length + 0x10))();
            }
            LOCK();
            lVar1 = local_1a8._M_string_length + 0xc;
            *(int *)lVar1 = *(int *)lVar1 + -1;
            UNLOCK();
            if (*(int *)lVar1 == 0) {
              if ((long *)local_1a8._M_string_length != (long *)0x0) {
                (**(code **)(*(long *)local_1a8._M_string_length + 8))();
              }
              local_1a8._M_string_length = 0;
            }
          }
          createCompositeBuffer<float>((SpirVAssembly *)&local_1a8,local_174);
          std::
          vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
          ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>
                    ((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
                      *)&local_a0,(SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_1a8);
          goto LAB_00544eaf;
        }
      }
      local_88[0] = 1;
      local_88[1] = 1;
      local_88[2] = 1;
      this = (SpvAsmComputeShaderCase *)operator_new(0x140);
      local_1a8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"name","");
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::at(params,&local_1a8);
      SpvAsmComputeShaderCase::SpvAsmComputeShaderCase
                (this,local_170,(pmVar6->_M_dataplus)._M_p,"OpCompositeInsert test",
                 (ComputeShaderSpec *)local_f8,COMPUTE_TEST_USES_NONE);
      tcu::TestNode::addChild(local_188,(TestNode *)this);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar2) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_p != &local_48) {
        operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
      }
      if (local_78 != (pointer)0x0) {
        operator_delete(local_78,(long)local_68 - (long)local_78);
      }
      std::
      vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
      ::~vector(&local_a0);
      std::
      vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
      ::~vector(&local_b8);
      if ((undefined1 *)local_f8._32_8_ != local_f8 + 0x30) {
        operator_delete((void *)local_f8._32_8_,local_f8._48_8_ + 1);
      }
      if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
        operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
      }
    }
    local_188 = (TestNode *)0x0;
    tcu::TestNode::addChild(local_180,pTVar4);
    std::
    vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~vector(&local_148);
    uVar8 = extraout_RDX_00;
    if (local_168 != &local_158) {
      operator_delete(local_168,local_158 + 1);
      uVar8 = extraout_RDX_01;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      uVar8 = extraout_RDX_02;
    }
    type = type + TYPE_UINT;
    if (type == TYPE_END) {
      return (TestCaseGroup *)local_180;
    }
  } while( true );
}

Assistant:

tcu::TestCaseGroup* createOpCompositeInsertGroup (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup>	group	(new tcu::TestCaseGroup(testCtx, "opcompositeinsert", "Test the OpCompositeInsert instruction"));
	de::Random						rnd		(deStringHash(group->getName()));

	for (int type = TYPE_INT; type != TYPE_END; ++type)
	{
		NumberType						numberType		= NumberType(type);
		const string					typeName		= getNumberTypeName(numberType);
		const string					description		= "Test the OpCompositeInsert instruction with " + typeName + "s";
		de::MovePtr<tcu::TestCaseGroup>	subGroup		(new tcu::TestCaseGroup(testCtx, typeName.c_str(), description.c_str()));
		vector<map<string, string> >	testCases;

		createCompositeCases(testCases, rnd, numberType);

		for (vector<map<string, string> >::const_iterator test = testCases.begin(); test != testCases.end(); ++test)
		{
			ComputeShaderSpec	spec;

			spec.assembly = specializeCompositeInsertShaderTemplate(numberType, *test);

			switch (numberType)
			{
				case TYPE_INT:
				{
					deInt32 number = getInt(rnd);
					spec.inputs.push_back(createCompositeBuffer<deInt32>(number));
					spec.outputs.push_back(createCompositeBuffer<deInt32>(number));
					break;
				}
				case TYPE_UINT:
				{
					deUint32 number = rnd.getUint32();
					spec.inputs.push_back(createCompositeBuffer<deUint32>(number));
					spec.outputs.push_back(createCompositeBuffer<deUint32>(number));
					break;
				}
				case TYPE_FLOAT:
				{
					float number = rnd.getFloat();
					spec.inputs.push_back(createCompositeBuffer<float>(number));
					spec.outputs.push_back(createCompositeBuffer<float>(number));
					break;
				}
				default:
					DE_ASSERT(false);
			}

			spec.numWorkGroups = IVec3(1, 1, 1);
			subGroup->addChild(new SpvAsmComputeShaderCase(testCtx, test->at("name").c_str(), "OpCompositeInsert test", spec));
		}
		group->addChild(subGroup.release());
	}
	return group.release();
}